

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_submodule_free(lys_submodule *submodule,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  ulong uVar1;
  long lVar2;
  
  if (submodule != (lys_submodule *)0x0) {
    module_free_common((lys_module *)submodule,private_destructor);
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < submodule->inc_size; uVar1 = uVar1 + 1) {
      lydict_remove(submodule->ctx,*(char **)(submodule->inc->rev + lVar2 + 0x18));
      lydict_remove(submodule->ctx,*(char **)(submodule->inc->rev + lVar2 + 0x20));
      lys_extension_instances_free
                (submodule->ctx,*(lys_ext_instance ***)(submodule->inc->rev + lVar2 + 0x10),
                 (uint)(byte)submodule->inc->rev[lVar2 + 0xb],private_destructor);
      lVar2 = lVar2 + 0x30;
    }
    free(submodule->inc);
    free(submodule);
    return;
  }
  return;
}

Assistant:

void
lys_submodule_free(struct lys_submodule *submodule, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    if (!submodule) {
        return;
    }

    /* common part with struct ly_module */
    module_free_common((struct lys_module *)submodule, private_destructor);

    /* include */
    for (i = 0; i < submodule->inc_size; i++) {
        lydict_remove(submodule->ctx, submodule->inc[i].dsc);
        lydict_remove(submodule->ctx, submodule->inc[i].ref);
        lys_extension_instances_free(submodule->ctx, submodule->inc[i].ext, submodule->inc[i].ext_size, private_destructor);
        /* complete submodule free is done only from main module since
         * submodules propagate their includes to the main module */
    }
    free(submodule->inc);

    free(submodule);
}